

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O1

int kwssys::kwsysUnPutEnv(string *env)

{
  int iVar1;
  long lVar2;
  char *extraout_RAX;
  char *pcVar3;
  string name;
  char *local_30 [2];
  char local_20 [16];
  
  lVar2 = std::__cxx11::string::find((char)env,0x3d);
  if (lVar2 != -1) {
    std::__cxx11::string::substr((ulong)local_30,(ulong)env);
    unsetenv(local_30[0]);
    pcVar3 = local_20;
    if (local_30[0] != pcVar3) {
      operator_delete(local_30[0]);
      pcVar3 = extraout_RAX;
    }
    return (int)pcVar3;
  }
  iVar1 = unsetenv((env->_M_dataplus)._M_p);
  return iVar1;
}

Assistant:

static int kwsysUnPutEnv(const std::string& env)
{
  size_t pos = env.find('=');
  if (pos != std::string::npos) {
    std::string name = env.substr(0, pos);
    unsetenv(name.c_str());
  } else {
    unsetenv(env.c_str());
  }
  return 0;
}